

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O2

void __thiscall kratos::EventRemoval::visit(EventRemoval *this,Generator *gen)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  shared_ptr<kratos::Stmt> *stmt_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> stmt_00;
  undefined1 local_68 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::AuxiliaryStmt> aux;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  
  psVar1 = (gen->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (gen->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (lVar3 = 0;
      stmt_00._M_pi =
           aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi, (long)psVar1 - (long)psVar2 >> 4 != lVar3; lVar3 = lVar3 + 1) {
    Generator::get_stmt((Generator *)local_68,(uint32_t)gen);
    if (*(int *)((long)local_68 + 0x78) == 0xd) {
      Stmt::as<kratos::AuxiliaryStmt>
                ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (*(int *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi[0xc]._vptr__Sp_counted_base == 0) {
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>&>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<kratos::Stmt> *)local_68);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aux);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  }
  for (; stmt_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      stmt_00._M_pi = stmt_00._M_pi + 1) {
    Generator::remove_stmt(gen,(shared_ptr<kratos::Stmt> *)stmt_00._M_pi);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &aux.super___shared_ptr<kratos::AuxiliaryStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void visit(Generator *gen) override {
        auto stmt_count = gen->stmts_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Auxiliary) {
                auto aux = stmt->as<AuxiliaryStmt>();
                if (aux->aux_type() == AuxiliaryType::EventTracing)
                    stmts_to_remove.emplace_back(stmt);
            }
        }
        for (auto const &stmt : stmts_to_remove) {
            gen->remove_stmt(stmt);
        }
    }